

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# words.c
# Opt level: O2

void update_error_limit(words_data *w,uint32_t flags)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  int32_t iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lStack_30;
  
  uVar6 = w->bitrate_acc[0] + w->bitrate_delta[0];
  w->bitrate_acc[0] = uVar6;
  uVar6 = uVar6 >> 0x10;
  if ((flags & 0x40000004) == 0) {
    uVar3 = w->bitrate_acc[1] + w->bitrate_delta[1];
    w->bitrate_acc[1] = uVar3;
    uVar3 = uVar3 >> 0x10;
    if ((flags >> 9 & 1) == 0) {
      uVar1 = exp2s(uVar6);
      w->c[0].error_limit = uVar1;
      lStack_30 = 0x48;
    }
    else {
      uVar5 = w->c[0].slow_level + 0x80 >> 8;
      uVar7 = w->c[1].slow_level + 0x80 >> 8;
      if ((flags >> 10 & 1) != 0) {
        iVar2 = (int)((uVar3 - uVar5) + uVar7 + 1) >> 1;
        if ((int)uVar6 < iVar2) {
          uVar3 = uVar6 * 2;
          uVar6 = 0;
        }
        else if (SBORROW4(uVar6,-iVar2) == (int)(uVar6 + iVar2) < 0) {
          uVar3 = iVar2 + uVar6;
          uVar6 = uVar6 - iVar2;
        }
        else {
          uVar6 = uVar6 * 2;
          uVar3 = 0;
        }
      }
      iVar2 = uVar5 - uVar6;
      uVar1 = 0;
      if (-0x100 < iVar2) {
        uVar1 = exp2s(iVar2 + 0x100);
      }
      w->c[0].error_limit = uVar1;
      iVar2 = uVar7 - uVar3;
      if (iVar2 < -0xff) {
        lStack_30 = 0x48;
        goto LAB_001a1172;
      }
      uVar3 = iVar2 + 0x100;
      lStack_30 = 0x48;
    }
  }
  else if ((flags >> 9 & 1) == 0) {
    lStack_30 = 0x34;
    uVar3 = uVar6;
  }
  else {
    iVar2 = (w->c[0].slow_level + 0x80 >> 8) - uVar6;
    if (iVar2 < -0xff) {
      lStack_30 = 0x34;
LAB_001a1172:
      iVar4 = 0;
      goto LAB_001a1174;
    }
    uVar3 = iVar2 + 0x100;
    lStack_30 = 0x34;
  }
  iVar4 = exp2s(uVar3);
LAB_001a1174:
  *(int32_t *)((long)w->bitrate_delta + lStack_30) = iVar4;
  return;
}

Assistant:

void update_error_limit (struct words_data *w, uint32_t flags)
{
    int bitrate_0 = (w->bitrate_acc [0] += w->bitrate_delta [0]) >> 16;

    if (flags & MONO_DATA) {
        if (flags & HYBRID_BITRATE) {
            int slow_log_0 = (w->c [0].slow_level + SLO) >> SLS;

            if (slow_log_0 - bitrate_0 > -0x100)
                w->c [0].error_limit = exp2s (slow_log_0 - bitrate_0 + 0x100);
            else
                w->c [0].error_limit = 0;
        }
        else
            w->c [0].error_limit = exp2s (bitrate_0);
    }
    else {
        int bitrate_1 = (w->bitrate_acc [1] += w->bitrate_delta [1]) >> 16;

        if (flags & HYBRID_BITRATE) {
            int slow_log_0 = (w->c [0].slow_level + SLO) >> SLS;
            int slow_log_1 = (w->c [1].slow_level + SLO) >> SLS;

            if (flags & HYBRID_BALANCE) {
                int balance = (slow_log_1 - slow_log_0 + bitrate_1 + 1) >> 1;

                if (balance > bitrate_0) {
                    bitrate_1 = bitrate_0 * 2;
                    bitrate_0 = 0;
                }
                else if (-balance > bitrate_0) {
                    bitrate_0 = bitrate_0 * 2;
                    bitrate_1 = 0;
                }
                else {
                    bitrate_1 = bitrate_0 + balance;
                    bitrate_0 = bitrate_0 - balance;
                }
            }

            if (slow_log_0 - bitrate_0 > -0x100)
                w->c [0].error_limit = exp2s (slow_log_0 - bitrate_0 + 0x100);
            else
                w->c [0].error_limit = 0;

            if (slow_log_1 - bitrate_1 > -0x100)
                w->c [1].error_limit = exp2s (slow_log_1 - bitrate_1 + 0x100);
            else
                w->c [1].error_limit = 0;
        }
        else {
            w->c [0].error_limit = exp2s (bitrate_0);
            w->c [1].error_limit = exp2s (bitrate_1);
        }
    }
}